

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::TimingPathSymbol::serializeTo(TimingPathSymbol *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  size_t sVar3;
  size_t __n;
  long lVar4;
  string_view name;
  string_view name_00;
  string_view name_01;
  
  ASTSerializer::write
            (serializer,0xe,"connectionKind",(ulong)(this->connectionKind != Full) * 4 + 4);
  __n = 7;
  sVar3 = 7;
  if (this->polarity != Unknown) {
    sVar3 = 8;
  }
  ASTSerializer::write(serializer,8,"polarity",sVar3);
  if (this->edgePolarity != Unknown) {
    __n = 8;
  }
  ASTSerializer::write(serializer,0xc,"edgePolarity",__n);
  sVar3 = strlen(*(char **)(toString(slang::ast::EdgeKind)::strings +
                           (long)(int)this->edgeIdentifier * 8));
  ASTSerializer::write(serializer,0xe,"edgeIdentifier",sVar3);
  ASTSerializer::write(serializer,0x10,"isStateDependent",(ulong)this->isStateDependent);
  if (this->isResolved == false) {
    resolve(this);
  }
  if (this->edgeSourceExpr != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xe,"edgeSourceExpr",(size_t)this->edgeSourceExpr);
  }
  if (this->isResolved == false) {
    resolve(this);
  }
  if (this->conditionExpr != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xd,"conditionExpr",(size_t)this->conditionExpr);
  }
  name._M_str = "inputs";
  name._M_len = 6;
  ASTSerializer::startArray(serializer,name);
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar1 = (this->inputs)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->inputs)._M_ptr;
    lVar4 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar4));
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  ASTSerializer::endArray(serializer);
  name_00._M_str = "outputs";
  name_00._M_len = 7;
  ASTSerializer::startArray(serializer,name_00);
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar1 = (this->outputs)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->outputs)._M_ptr;
    lVar4 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar4));
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  ASTSerializer::endArray(serializer);
  name_01._M_str = "delays";
  name_01._M_len = 6;
  ASTSerializer::startArray(serializer,name_01);
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar1 = (this->delays)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->delays)._M_ptr;
    lVar4 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar4));
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void TimingPathSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("connectionKind",
                     connectionKind == ConnectionKind::Full ? "Full"sv : "Parallel"sv);
    serializer.write("polarity", toString(polarity));
    serializer.write("edgePolarity", toString(edgePolarity));
    serializer.write("edgeIdentifier", toString(edgeIdentifier));
    serializer.write("isStateDependent", isStateDependent);

    if (auto expr = getEdgeSourceExpr())
        serializer.write("edgeSourceExpr", *expr);

    if (auto expr = getConditionExpr())
        serializer.write("conditionExpr", *expr);

    serializer.startArray("inputs");
    for (auto expr : getInputs())
        serializer.serialize(*expr);
    serializer.endArray();

    serializer.startArray("outputs");
    for (auto expr : getOutputs())
        serializer.serialize(*expr);
    serializer.endArray();

    serializer.startArray("delays");
    for (auto expr : getDelays())
        serializer.serialize(*expr);
    serializer.endArray();
}